

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::ImageLayer::ImageLayer(ImageLayer *this,Layer *layerData)

{
  Extra *pEVar1;
  Asset *pAVar2;
  rc_ptr<Impl> rVar3;
  VBrush brush;
  VBrush local_28;
  
  Layer::Layer(&this->super_Layer,layerData);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__ImageLayer_00144bf0;
  VDrawable::VDrawable(&(this->mRenderNode).super_VDrawable,Fill);
  (this->mRenderNode).mCNode._M_t.super___uniq_ptr_impl<LOTNode,_std::default_delete<LOTNode>_>._M_t
  .super__Tuple_impl<0UL,_LOTNode_*,_std::default_delete<LOTNode>_>.
  super__Head_base<0UL,_LOTNode_*,_false>._M_head_impl = (LOTNode *)0x0;
  (this->mTexture).mBitmap.mImpl.mModel = (model *)0x0;
  (this->mTexture).mMatrix.m11 = 1.0;
  (this->mTexture).mMatrix.m12 = 0.0;
  (this->mTexture).mMatrix.m13 = 0.0;
  (this->mTexture).mMatrix.m21 = 0.0;
  (this->mTexture).mMatrix.m22 = 1.0;
  (this->mTexture).mMatrix.m23 = 0.0;
  (this->mTexture).mMatrix.mtx = 0.0;
  (this->mTexture).mMatrix.mty = 0.0;
  (this->mTexture).mMatrix.m33 = 1.0;
  (this->mTexture).mMatrix.mType = None;
  (this->mTexture).mMatrix.dirty = None;
  (this->mTexture).mAlpha = 0xff;
  vcow_ptr<VPath::VPathData>::vcow_ptr(&(this->mPath).d);
  this->mDrawableList = &(this->mRenderNode).super_VDrawable;
  pEVar1 = (((this->super_Layer).mLayerData)->mExtra)._M_t.
           super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl;
  if ((pEVar1 != (Extra *)0x0) && (pAVar2 = pEVar1->mAsset, pAVar2 != (Asset *)0x0)) {
    rVar3.mModel = (pAVar2->mBitmap).mImpl.mModel;
    if (rVar3.mModel != (model *)0x0) {
      (rVar3.mModel)->mRef = (rVar3.mModel)->mRef + 1;
    }
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref
              ((vshared_ptr<VBitmap::Impl,_unsigned_long> *)&this->mTexture);
    (this->mTexture).mBitmap.mImpl.mModel = rVar3.mModel;
    local_28.mType = NoBrush;
    local_28._4_4_ = 0;
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref
              ((vshared_ptr<VBitmap::Impl,_unsigned_long> *)&local_28);
    VBrush::VBrush(&local_28,&this->mTexture);
    (this->mRenderNode).super_VDrawable.mBrush.mType = local_28.mType;
    *(undefined4 *)&(this->mRenderNode).super_VDrawable.mBrush.field_0x4 = local_28._4_4_;
    (this->mRenderNode).super_VDrawable.mBrush.field_1 = local_28.field_1;
  }
  return;
}

Assistant:

renderer::ImageLayer::ImageLayer(model::Layer *layerData)
    : renderer::Layer(layerData)
{
    mDrawableList = &mRenderNode;

    if (!mLayerData->asset()) return;

    mTexture.mBitmap = mLayerData->asset()->bitmap();
    VBrush brush(&mTexture);
    mRenderNode.setBrush(brush);
}